

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O3

void read_debug_rbsp_slice_trailing_bits(h264_stream_t *h,bs_t *b)

{
  byte *pbVar1;
  int iVar2;
  uint8_t *puVar3;
  uint32_t r;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  FILE *pFVar7;
  bool bVar8;
  
  read_debug_rbsp_trailing_bits(b);
  if ((h->pps->entropy_coding_mode_flag != 0) && (puVar3 = b->p, puVar3 < b->end)) {
    do {
      pFVar7 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar7 = _stdout;
      }
      uVar4 = 0;
      fprintf(pFVar7,"%ld.%d: ",(long)puVar3 - (long)b->start,(ulong)(uint)b->bits_left);
      pbVar1 = b->p;
      uVar5 = b->bits_left;
      iVar2 = 0xf;
      do {
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        uVar6 = 0;
        if (pbVar1 < b->end) {
          uVar6 = (uint)((*pbVar1 >> (uVar5 & 0x1f) & 1) != 0);
        }
        if (uVar5 == 0) {
          pbVar1 = pbVar1 + 1;
          b->p = pbVar1;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar4 = (ulong)((uint)uVar4 | uVar6 << ((byte)iVar2 & 0x1f));
        bVar8 = iVar2 != 0;
        iVar2 = iVar2 + -1;
      } while (bVar8);
      pFVar7 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar7 = _stdout;
      }
      fprintf(pFVar7,"cabac_zero_word: %d \n",uVar4);
      puVar3 = b->p;
    } while (puVar3 < b->end);
  }
  return;
}

Assistant:

void read_debug_rbsp_slice_trailing_bits(h264_stream_t* h, bs_t* b)
{
    read_debug_rbsp_trailing_bits(b);
    if( h->pps->entropy_coding_mode_flag )
    {
        while( more_rbsp_trailing_data(h, b) )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); int cabac_zero_word = bs_read_u(b, 16); printf("cabac_zero_word: %d \n", cabac_zero_word); 
        }
    }
}